

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetString_Test::
TestBody(MicroStringPrevTest_AssignmentViaSetString_Test *this)

{
  MicroString *this_00;
  Arena *pAVar1;
  size_t prev_arena_used;
  size_t sVar2;
  ParamType *pPVar3;
  char *message;
  bool allocated_on_arena;
  string_view sVar4;
  string_view local_70;
  string_view local_60;
  size_t local_50;
  AssertionResult gtest_ar;
  MicroString source;
  
  pAVar1 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  source = MicroStringPrevTest::MakeFromState(kString,pAVar1);
  prev_arena_used = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  this_00 = &(this->super_MicroStringPrevTest).str_;
  local_50 = MicroString::SpaceUsedExcludingSelfLong(this_00);
  sVar2 = MicroString::Capacity(this_00);
  sVar4 = MicroString::Get(&source);
  pAVar1 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  MicroString::SetFromOtherImpl<google::protobuf::internal::MicroString>(this_00,&source,pAVar1);
  local_60 = MicroString::Get(this_00);
  local_70 = MicroString::Get(&source);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)&gtest_ar,"str_.Get()","source.Get()",&local_60,&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x307,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_60._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  allocated_on_arena = sVar2 < sVar4._M_len;
  sVar2 = local_50;
  if (allocated_on_arena) {
    sVar4 = MicroString::Get(this_00);
    sVar2 = sVar4._M_len + 2;
  }
  MicroStringPrevTest::ExpectMemoryUsed
            (&this->super_MicroStringPrevTest,prev_arena_used,allocated_on_arena,sVar2,
             (MicroString *)0x0);
  pPVar3 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if ((pPVar3->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Head_base<0UL,_bool,_false>._M_head_impl == false) {
    MicroString::Destroy(&source);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetString) {
  MicroString source = MakeFromState(kString, arena());

  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  const bool will_reuse = str_.Capacity() >= source.Get().size();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kMicroRepSize + str_.Get().size());
  }

  if (!has_arena()) source.Destroy();
}